

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O3

void sys_open(Process *proc,Args *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  int fd;
  path path;
  path local_80;
  path local_60;
  string local_40;
  
  ReadString_abi_cxx11_(&local_40,(pid_t)args->PID,args->Arg[0]);
  paVar1 = &local_80.m_pathname.field_2;
  local_80.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  Process::Normalise(&local_60,proc,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_pathname._M_dataplus._M_p,
                    local_80.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (-1 < args->Return) {
    uVar2 = args->Arg[1];
    fd = (int)args->Return;
    Process::MapFd(proc,fd,&local_60);
    Process::SetCloseExec(proc,fd,(bool)((byte)(uVar2 >> 0x13) & 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_pathname._M_dataplus._M_p != &local_60.m_pathname.field_2) {
    operator_delete(local_60.m_pathname._M_dataplus._M_p,
                    local_60.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void sys_open(Process *proc, const Args &args)
{
  const fs::path path = proc->Normalise(ReadString(args.PID, args[0]));
  const uint64_t flags = args[1];
  const int fd = args.Return;

  if (args.Return >= 0) {
    proc->MapFd(fd, path);
    proc->SetCloseExec(fd, flags & O_CLOEXEC);
  }
}